

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void laguerre_ek_compute(int n,double *x,double *w)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *e;
  double dVar3;
  double zemu;
  int i;
  double *bj;
  double *w_local;
  double *x_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  e = (double *)operator_new__(uVar2);
  for (zemu._4_4_ = 0; zemu._4_4_ < n; zemu._4_4_ = zemu._4_4_ + 1) {
    e[zemu._4_4_] = (double)(zemu._4_4_ + 1);
  }
  for (zemu._4_4_ = 0; zemu._4_4_ < n; zemu._4_4_ = zemu._4_4_ + 1) {
    x[zemu._4_4_] = (double)(zemu._4_4_ * 2 + 1);
  }
  dVar3 = sqrt(1.0);
  *w = dVar3;
  for (zemu._4_4_ = 1; zemu._4_4_ < n; zemu._4_4_ = zemu._4_4_ + 1) {
    w[zemu._4_4_] = 0.0;
  }
  imtqlx(n,x,e,w);
  for (zemu._4_4_ = 0; zemu._4_4_ < n; zemu._4_4_ = zemu._4_4_ + 1) {
    w[zemu._4_4_] = w[zemu._4_4_] * w[zemu._4_4_];
  }
  if (e != (double *)0x0) {
    operator_delete__(e);
  }
  return;
}

Assistant:

void laguerre_ek_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_EK_COMPUTE: Laguerre quadrature rule by the Elhay-Kautsky method.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *bj;
  int i;
  double zemu;
//
//  Define the zero-th moment.
//
  zemu = 1.0;
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  for ( i = 0; i < n; i++ )
  {
    bj[i] = double( i + 1 );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = double( 2 * i + 1 );
  }

  w[0] = sqrt ( zemu );

  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}